

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

long passthrough_resampler_fill_input_left
               (cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,
               long nframes)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  iVar2 = *user_ptr;
  local_48 = nframes;
  local_40 = nframes;
  local_38 = input_buffer;
  if (iVar2 == 3) {
    local_68.ptr_._0_4_ = 0x20;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar,"nframes","32",&local_40,(int *)&local_68);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pvVar1 = local_38;
      for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&gtest_ar,"input[i]","0.01 * (i + 32)",
                   *(float *)((long)pvVar1 + lVar3 * 4),(float)(int)((uint)lVar3 | 0x20) * 0.01);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_68);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar2 = 0x3f6;
          goto LAB_0010af37;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
      lVar3 = 0;
      while( true ) {
        if (lVar3 == 0x10) {
          return local_48;
        }
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&gtest_ar,"input[i + 32]","0.01 * i",
                   *(float *)((long)pvVar1 + lVar3 * 4 + 0x80),(float)(int)lVar3 * 0.01);
        if (gtest_ar.success_ == false) break;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&gtest_ar,"input[i + 32 + 16]","0.0",
                   *(float *)((long)pvVar1 + lVar3 * 4 + 0xc0),0.0);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_68);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar2 = 0x3fc;
          goto LAB_0010b033;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar3 = lVar3 + 1;
      }
      testing::Message::Message((Message *)&local_68);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar2 = 0x3fa;
LAB_0010aff5:
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,iVar2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
LAB_0010b051:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
      goto LAB_0010b05b;
    }
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x3f1;
  }
  else if (iVar2 == 2) {
    local_68.ptr_._0_4_ = 0x20;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar,"nframes","32",&local_40,(int *)&local_68);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pvVar1 = local_38;
      lVar3 = 0;
      while( true ) {
        if (lVar3 == 0x20) {
          return local_48;
        }
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&gtest_ar,"input[i]","0.01 * (i + 64)",
                   *(float *)((long)pvVar1 + lVar3 * 4),(float)(int)((uint)lVar3 | 0x40) * 0.01);
        if (gtest_ar.success_ == false) break;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&gtest_ar,"input[i + 32]","0.01 * i",
                   *(float *)((long)pvVar1 + lVar3 * 4 + 0x80),(float)(int)(uint)lVar3 * 0.01);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_68);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar2 = 0x3ec;
LAB_0010b033:
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                     ,iVar2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          goto LAB_0010b051;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar3 = lVar3 + 1;
      }
      testing::Message::Message((Message *)&local_68);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar2 = 0x3ea;
      goto LAB_0010aff5;
    }
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x3e5;
  }
  else {
    if (iVar2 != 1) {
      return nframes;
    }
    local_68.ptr_._0_4_ = 0x20;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar,"nframes","32",&local_40,(int *)&local_68);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pvVar1 = local_38;
      lVar3 = 0;
      while( true ) {
        if (lVar3 == 0x40) {
          return local_48;
        }
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&gtest_ar,"input[i]","0.01 * i",*(float *)((long)pvVar1 + lVar3 * 4),
                   (float)(int)lVar3 * 0.01);
        if (gtest_ar.success_ == false) break;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar3 = lVar3 + 1;
      }
      testing::Message::Message((Message *)&local_68);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar2 = 0x3e0;
LAB_0010af37:
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,iVar2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
      goto LAB_0010b05b;
    }
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x3dd;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
             ,iVar2,pcVar4);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_68);
LAB_0010b05b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return local_48;
}

Assistant:

static long
passthrough_resampler_fill_input_left(cubeb_stream * stream,
                                     void * user_ptr,
                                     void const * input_buffer,
                                     void * output_buffer,
                                     long nframes) {
  // gtest does not support using ASSERT_EQ and friends in a
  // function that returns a value.
  int iteration = *static_cast<int*>(user_ptr);
  if (iteration == 1) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 64; ++i) {
        ASSERT_FLOAT_EQ(input[i], 0.01 * i);
      }
    }();
  } else if (iteration == 2) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 32; ++i) {
        // First part contains the reamaining input samples from previous
        // iteration (since they were more).
        ASSERT_FLOAT_EQ(input[i], 0.01 * (i + 64));
        // next part contains the new buffer
        ASSERT_FLOAT_EQ(input[i + 32], 0.01 * i);
      }
    }();
  } else if (iteration == 3) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 32; ++i) {
        // First part (16 frames) contains the reamaining input samples
        // from previous iteration (since they were more).
        ASSERT_FLOAT_EQ(input[i], 0.01 * (i + 32));
      }
      for (int i = 0; i < 16; ++i) {
        // next part (8 frames) contains the new input buffer.
        ASSERT_FLOAT_EQ(input[i + 32], 0.01 * i);
        // last part (8 frames) contains silence.
        ASSERT_FLOAT_EQ(input[i + 32 + 16], 0.0);
      }
    }();
  }
  return nframes;
}